

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkBorderColor vk::mapBorderColor(TextureChannelClass channelClass,GenericVec4 *color)

{
  bool bVar1;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  undefined1 local_a8 [8];
  Vec4 fColor;
  Vector<int,_4> local_88;
  Vector<int,_4> local_78;
  undefined1 local_68 [8];
  IVec4 sColor;
  Vector<unsigned_int,_4> local_48;
  Vector<unsigned_int,_4> local_38;
  undefined1 local_28 [8];
  UVec4 uColor;
  GenericVec4 *color_local;
  TextureChannelClass channelClass_local;
  
  uColor.m_data._8_8_ = color;
  if (channelClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    rr::GenericVec4::get<unsigned_int>((GenericVec4 *)local_28);
    tcu::Vector<unsigned_int,_4>::Vector(&local_38,0,0,0,0);
    bVar1 = tcu::Vector<unsigned_int,_4>::operator==((Vector<unsigned_int,_4> *)local_28,&local_38);
    if (bVar1) {
      return VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
    }
    tcu::Vector<unsigned_int,_4>::Vector(&local_48,0,0,0,1);
    bVar1 = tcu::Vector<unsigned_int,_4>::operator==((Vector<unsigned_int,_4> *)local_28,&local_48);
    if (bVar1) {
      return VK_BORDER_COLOR_INT_OPAQUE_BLACK;
    }
    tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(sColor.m_data + 2),1,1,1,1);
    bVar1 = tcu::Vector<unsigned_int,_4>::operator==
                      ((Vector<unsigned_int,_4> *)local_28,
                       (Vector<unsigned_int,_4> *)(sColor.m_data + 2));
    if (bVar1) {
      return VK_BORDER_COLOR_INT_OPAQUE_WHITE;
    }
  }
  else if (channelClass == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    rr::GenericVec4::get<int>((GenericVec4 *)local_68);
    tcu::Vector<int,_4>::Vector(&local_78,0,0,0,0);
    bVar1 = tcu::Vector<int,_4>::operator==((Vector<int,_4> *)local_68,&local_78);
    if (bVar1) {
      return VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
    }
    tcu::Vector<int,_4>::Vector(&local_88,0,0,0,1);
    bVar1 = tcu::Vector<int,_4>::operator==((Vector<int,_4> *)local_68,&local_88);
    if (bVar1) {
      return VK_BORDER_COLOR_INT_OPAQUE_BLACK;
    }
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(fColor.m_data + 2),1,1,1,1);
    bVar1 = tcu::Vector<int,_4>::operator==
                      ((Vector<int,_4> *)local_68,(Vector<int,_4> *)(fColor.m_data + 2));
    if (bVar1) {
      return VK_BORDER_COLOR_INT_OPAQUE_WHITE;
    }
  }
  else {
    rr::GenericVec4::get<float>((GenericVec4 *)local_a8);
    tcu::Vector<float,_4>::Vector(&local_b8,0.0,0.0,0.0,0.0);
    bVar1 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)local_a8,&local_b8);
    if (bVar1) {
      return VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    }
    tcu::Vector<float,_4>::Vector(&local_c8,0.0,0.0,0.0,1.0);
    bVar1 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)local_a8,&local_c8);
    if (bVar1) {
      return VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
    }
    tcu::Vector<float,_4>::Vector(&local_d8,1.0,1.0,1.0,1.0);
    bVar1 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)local_a8,&local_d8);
    if (bVar1) {
      return VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
    }
  }
  return VK_BORDER_COLOR_LAST;
}

Assistant:

static VkBorderColor mapBorderColor (tcu::TextureChannelClass channelClass, const rr::GenericVec4& color)
{
	if (channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
	{
		const tcu::UVec4	uColor	= color.get<deUint32>();

		if (uColor		== tcu::UVec4(0, 0, 0, 0)) return VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
		else if (uColor	== tcu::UVec4(0, 0, 0, 1)) return VK_BORDER_COLOR_INT_OPAQUE_BLACK;
		else if (uColor == tcu::UVec4(1, 1, 1, 1)) return VK_BORDER_COLOR_INT_OPAQUE_WHITE;
	}
	else if (channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
	{
		const tcu::IVec4	sColor	= color.get<deInt32>();

		if (sColor		== tcu::IVec4(0, 0, 0, 0)) return VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
		else if (sColor	== tcu::IVec4(0, 0, 0, 1)) return VK_BORDER_COLOR_INT_OPAQUE_BLACK;
		else if (sColor == tcu::IVec4(1, 1, 1, 1)) return VK_BORDER_COLOR_INT_OPAQUE_WHITE;
	}
	else
	{
		const tcu::Vec4		fColor	= color.get<float>();

		if (fColor		== tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f)) return VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
		else if (fColor == tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)) return VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
		else if (fColor == tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f)) return VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
	}

	DE_FATAL("Unsupported border color");
	return VK_BORDER_COLOR_LAST;
}